

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O0

void __thiscall
libcellml::GeneratorProfile::setInterfaceComputeVariablesMethodString
          (GeneratorProfile *this,bool forDifferentialModel,bool withExternalVariables,
          string *interfaceComputeVariablesMethodString)

{
  string *interfaceComputeVariablesMethodString_local;
  bool withExternalVariables_local;
  bool forDifferentialModel_local;
  GeneratorProfile *this_local;
  
  if (forDifferentialModel) {
    if (withExternalVariables) {
      std::__cxx11::string::operator=
                ((string *)&this->mPimpl->mInterfaceComputeVariablesMethodFdmWevString,
                 (string *)interfaceComputeVariablesMethodString);
    }
    else {
      std::__cxx11::string::operator=
                ((string *)&this->mPimpl->mInterfaceComputeVariablesMethodFdmWoevString,
                 (string *)interfaceComputeVariablesMethodString);
    }
  }
  else if (withExternalVariables) {
    std::__cxx11::string::operator=
              ((string *)&this->mPimpl->mInterfaceComputeVariablesMethodFamWevString,
               (string *)interfaceComputeVariablesMethodString);
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&this->mPimpl->mInterfaceComputeVariablesMethodFamWoevString,
               (string *)interfaceComputeVariablesMethodString);
  }
  return;
}

Assistant:

void GeneratorProfile::setInterfaceComputeVariablesMethodString(bool forDifferentialModel,
                                                                bool withExternalVariables,
                                                                const std::string &interfaceComputeVariablesMethodString)
{
    if (forDifferentialModel) {
        if (withExternalVariables) {
            mPimpl->mInterfaceComputeVariablesMethodFdmWevString = interfaceComputeVariablesMethodString;
        } else {
            mPimpl->mInterfaceComputeVariablesMethodFdmWoevString = interfaceComputeVariablesMethodString;
        }
    } else {
        if (withExternalVariables) {
            mPimpl->mInterfaceComputeVariablesMethodFamWevString = interfaceComputeVariablesMethodString;
        } else {
            mPimpl->mInterfaceComputeVariablesMethodFamWoevString = interfaceComputeVariablesMethodString;
        }
    }
}